

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O2

void twitter::zipkin::thrift::swap(Span *a,Span *b)

{
  bool bVar1;
  _Span__isset _Var2;
  int64_t iVar3;
  
  iVar3 = a->trace_id;
  a->trace_id = b->trace_id;
  b->trace_id = iVar3;
  std::__cxx11::string::swap((string *)&a->name);
  iVar3 = a->id;
  a->id = b->id;
  b->id = iVar3;
  iVar3 = a->parent_id;
  a->parent_id = b->parent_id;
  b->parent_id = iVar3;
  std::
  _Vector_base<twitter::zipkin::thrift::Annotation,_std::allocator<twitter::zipkin::thrift::Annotation>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&a->annotations,(_Vector_impl_data *)&b->annotations);
  std::
  _Vector_base<twitter::zipkin::thrift::BinaryAnnotation,_std::allocator<twitter::zipkin::thrift::BinaryAnnotation>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&a->binary_annotations,(_Vector_impl_data *)&b->binary_annotations
            );
  bVar1 = a->debug;
  a->debug = b->debug;
  b->debug = bVar1;
  iVar3 = a->timestamp;
  a->timestamp = b->timestamp;
  b->timestamp = iVar3;
  iVar3 = a->duration;
  a->duration = b->duration;
  b->duration = iVar3;
  iVar3 = a->trace_id_high;
  a->trace_id_high = b->trace_id_high;
  b->trace_id_high = iVar3;
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(Span &a, Span &b) {
  using ::std::swap;
  swap(a.trace_id, b.trace_id);
  swap(a.name, b.name);
  swap(a.id, b.id);
  swap(a.parent_id, b.parent_id);
  swap(a.annotations, b.annotations);
  swap(a.binary_annotations, b.binary_annotations);
  swap(a.debug, b.debug);
  swap(a.timestamp, b.timestamp);
  swap(a.duration, b.duration);
  swap(a.trace_id_high, b.trace_id_high);
  swap(a.__isset, b.__isset);
}